

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBars<unsigned_short>
               (char *label_id,unsigned_short *xs,unsigned_short *ys,int count,double width,
               int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<unsigned_short> getter;
  int stride_local;
  int offset_local;
  double width_local;
  int count_local;
  unsigned_short *ys_local;
  unsigned_short *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<unsigned_short>::GetterXsYs
            ((GetterXsYs<unsigned_short> *)local_58,xs,ys,count,offset,stride);
  PlotBarsEx<ImPlot::GetterXsYs<unsigned_short>>
            (label_id,(GetterXsYs<unsigned_short> *)local_58,width);
  return;
}

Assistant:

void PlotBars(const char* label_id, const T* xs, const T* ys, int count, double width, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsEx(label_id, getter, width);
}